

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

int __thiscall despot::Parser::NumInitialStates(Parser *this)

{
  pointer pTVar1;
  int iVar2;
  pointer pSVar3;
  ulong uVar4;
  pointer pSVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  double dVar9;
  
  dVar9 = LogNumInitialStates(this);
  iVar2 = -1;
  if (dVar9 <= 30.0) {
    pSVar5 = (this->prev_state_vars_).
             super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar3 = (this->prev_state_vars_).
             super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
             super__Vector_impl_data._M_finish;
    iVar2 = 1;
    if (pSVar3 != pSVar5) {
      uVar8 = 0;
      do {
        iVar6 = 0;
        if (0 < (int)((ulong)((long)pSVar5[uVar8].super_NamedVar.super_Variable.values_.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)pSVar5[uVar8].super_NamedVar.super_Variable.values_.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 5)) {
          iVar7 = 0;
          iVar6 = 0;
          do {
            pTVar1 = (this->initial_belief_funcs_).
                     super__Vector_base<despot::TabularCPT,_std::allocator<despot::TabularCPT>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            dVar9 = (double)(**(code **)((long)pTVar1[uVar8].super_CPT.super_Function._vptr_Function
                                        + 0x20))(pTVar1 + uVar8,0,iVar7);
            iVar6 = iVar6 + (uint)(0.0 < dVar9);
            iVar7 = iVar7 + 1;
            pSVar5 = (this->prev_state_vars_).
                     super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl
                     .super__Vector_impl_data._M_start;
          } while (iVar7 < (int)((ulong)((long)pSVar5[uVar8].super_NamedVar.super_Variable.values_.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)pSVar5[uVar8].super_NamedVar.super_Variable.values_.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 5));
          pSVar3 = (this->prev_state_vars_).
                   super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        }
        iVar2 = iVar2 * iVar6;
        uVar8 = uVar8 + 1;
        uVar4 = ((long)pSVar3 - (long)pSVar5 >> 6) * -0x5555555555555555;
      } while (uVar8 <= uVar4 && uVar4 - uVar8 != 0);
    }
  }
  return iVar2;
}

Assistant:

int Parser::NumInitialStates() const {
	if (LogNumInitialStates() > 30) {
		return -1;
	} else {
		int num_states = 1;

		for (int s = 0; s < prev_state_vars_.size(); s++) {
			int n = 0;
			for (int v = 0; v < prev_state_vars_[s].Size(); v++)
				n += (initial_belief_funcs_[s].GetValue(0, v) > 0);
			num_states *= n;
		}

		return num_states;
	}
}